

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

void __thiscall
prevector<8u,int,unsigned_int,int>::emplace_back<int_const&>
          (prevector<8u,int,unsigned_int,int> *this,int *args)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  prevector<8u,int,unsigned_int,int> *ppVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(this + 0x20);
  uVar3 = uVar1 - 9;
  uVar4 = *(uint *)(this + 8);
  if (uVar1 < 9) {
    uVar3 = uVar1;
    uVar4 = 8;
  }
  uVar3 = uVar3 + 1;
  if (uVar4 < uVar3) {
    prevector<8U,_int,_unsigned_int,_int>::change_capacity
              ((prevector<8U,_int,_unsigned_int,_int> *)this,(uVar3 >> 1) + uVar3);
  }
  uVar1 = *(uint *)(this + 0x20);
  uVar4 = uVar1 - 9;
  if (uVar1 < 9) {
    uVar4 = uVar1;
  }
  ppVar5 = *(prevector<8u,int,unsigned_int,int> **)this;
  if (uVar1 < 9) {
    ppVar5 = this;
  }
  *(int *)(ppVar5 + (long)(int)uVar4 * 4) = *args;
  *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace_back(Args&&... args) {
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        new(item_ptr(size())) T(std::forward<Args>(args)...);
        _size++;
    }